

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

void handle_filter_opt(char *_arg,int en)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  char *__s1;
  gpu_object_decoder *pgVar27;
  long lVar28;
  int *piVar29;
  long lVar30;
  char *tokens;
  char *local_40;
  char *local_38;
  
  local_40 = strdup(_arg);
  local_38 = local_40;
  if (local_40 != (char *)0x0) {
    uVar24 = (uint)(en == 0);
    do {
      __s1 = strsep(&local_40,",");
      iVar25 = strcmp(__s1,"write");
      iVar26 = dump_decoded_ioctl_data;
      iVar1 = dump_tsc;
      iVar2 = dump_tic;
      iVar3 = dump_vp;
      iVar4 = dump_fp;
      iVar5 = dump_gp;
      iVar6 = dump_cp;
      iVar7 = dump_tep;
      iVar8 = dump_tcp;
      iVar9 = dump_buffer_usage;
      iVar10 = decode_pb;
      iVar11 = dump_sys_mmap;
      iVar12 = dump_sys_munmap;
      iVar13 = dump_sys_mremap;
      iVar14 = dump_sys_open;
      iVar15 = dump_msg;
      iVar16 = dump_sys_write;
      iVar17 = dump_object_tree_on_create_destroy;
      iVar18 = en;
      iVar19 = dump_memory_reads;
      iVar20 = info;
      iVar21 = dump_raw_ioctl_data;
      iVar22 = dump_sys_mmap_details;
      iVar23 = print_gpu_addresses;
      if ((((iVar25 != 0) &&
           (iVar25 = strcmp(__s1,"read"), iVar26 = dump_decoded_ioctl_data, iVar1 = dump_tsc,
           iVar2 = dump_tic, iVar3 = dump_vp, iVar4 = dump_fp, iVar5 = dump_gp, iVar6 = dump_cp,
           iVar7 = dump_tep, iVar8 = dump_tcp, iVar9 = dump_buffer_usage, iVar10 = decode_pb,
           iVar11 = dump_sys_mmap, iVar12 = dump_sys_munmap, iVar13 = dump_sys_mremap,
           iVar14 = dump_sys_open, iVar15 = dump_msg, iVar16 = dump_sys_write,
           iVar17 = dump_object_tree_on_create_destroy, iVar18 = dump_memory_writes, iVar19 = en,
           iVar20 = info, iVar21 = dump_raw_ioctl_data, iVar22 = dump_sys_mmap_details,
           iVar23 = print_gpu_addresses, iVar25 != 0)) &&
          (iVar25 = strcmp(__s1,"gpu-addr"), iVar26 = dump_decoded_ioctl_data, iVar1 = dump_tsc,
          iVar2 = dump_tic, iVar3 = dump_vp, iVar4 = dump_fp, iVar5 = dump_gp, iVar6 = dump_cp,
          iVar7 = dump_tep, iVar8 = dump_tcp, iVar9 = dump_buffer_usage, iVar10 = decode_pb,
          iVar11 = dump_sys_mmap, iVar12 = dump_sys_munmap, iVar13 = dump_sys_mremap,
          iVar14 = dump_sys_open, iVar15 = dump_msg, iVar16 = dump_sys_write,
          iVar17 = dump_object_tree_on_create_destroy, iVar18 = dump_memory_writes,
          iVar19 = dump_memory_reads, iVar20 = info, iVar21 = dump_raw_ioctl_data,
          iVar22 = dump_sys_mmap_details, iVar23 = en, iVar25 != 0)) &&
         (((iVar25 = strcmp(__s1,"mem"), iVar26 = dump_decoded_ioctl_data, iVar1 = dump_tsc,
           iVar2 = dump_tic, iVar3 = dump_vp, iVar4 = dump_fp, iVar5 = dump_gp, iVar6 = dump_cp,
           iVar7 = dump_tep, iVar8 = dump_tcp, iVar9 = dump_buffer_usage, iVar10 = decode_pb,
           iVar11 = dump_sys_mmap, iVar12 = dump_sys_munmap, iVar13 = dump_sys_mremap,
           iVar14 = dump_sys_open, iVar15 = dump_msg, iVar16 = dump_sys_write,
           iVar17 = dump_object_tree_on_create_destroy, iVar18 = en, iVar19 = en, iVar20 = info,
           iVar21 = dump_raw_ioctl_data, iVar22 = dump_sys_mmap_details,
           iVar23 = print_gpu_addresses, iVar25 != 0 &&
           (iVar25 = strcmp(__s1,"ioctl-raw"), iVar26 = dump_decoded_ioctl_data, iVar1 = dump_tsc,
           iVar2 = dump_tic, iVar3 = dump_vp, iVar4 = dump_fp, iVar5 = dump_gp, iVar6 = dump_cp,
           iVar7 = dump_tep, iVar8 = dump_tcp, iVar9 = dump_buffer_usage, iVar10 = decode_pb,
           iVar11 = dump_sys_mmap, iVar12 = dump_sys_munmap, iVar13 = dump_sys_mremap,
           iVar14 = dump_sys_open, iVar15 = dump_msg, iVar16 = dump_sys_write,
           iVar17 = dump_object_tree_on_create_destroy, iVar18 = dump_memory_writes,
           iVar19 = dump_memory_reads, iVar20 = info, iVar21 = en, iVar22 = dump_sys_mmap_details,
           iVar23 = print_gpu_addresses, iVar25 != 0)) &&
          (iVar25 = strcmp(__s1,"ioctl-desc"), iVar26 = en, iVar1 = dump_tsc, iVar2 = dump_tic,
          iVar3 = dump_vp, iVar4 = dump_fp, iVar5 = dump_gp, iVar6 = dump_cp, iVar7 = dump_tep,
          iVar8 = dump_tcp, iVar9 = dump_buffer_usage, iVar10 = decode_pb, iVar11 = dump_sys_mmap,
          iVar12 = dump_sys_munmap, iVar13 = dump_sys_mremap, iVar14 = dump_sys_open,
          iVar15 = dump_msg, iVar16 = dump_sys_write, iVar17 = dump_object_tree_on_create_destroy,
          iVar18 = dump_memory_writes, iVar19 = dump_memory_reads, iVar20 = info,
          iVar21 = dump_raw_ioctl_data, iVar22 = dump_sys_mmap_details, iVar23 = print_gpu_addresses
          , iVar25 != 0)))) {
        iVar26 = strcmp(__s1,"ioctl");
        if (iVar26 == 0) {
          iVar26 = en;
          iVar1 = dump_tsc;
          iVar2 = dump_tic;
          iVar3 = dump_vp;
          iVar4 = dump_fp;
          iVar5 = dump_gp;
          iVar6 = dump_cp;
          iVar7 = dump_tep;
          iVar8 = dump_tcp;
          iVar9 = dump_buffer_usage;
          iVar10 = decode_pb;
          iVar11 = dump_sys_mmap;
          iVar12 = dump_sys_munmap;
          iVar13 = dump_sys_mremap;
          iVar14 = dump_sys_open;
          iVar15 = dump_msg;
          iVar16 = dump_sys_write;
          iVar17 = en;
          iVar18 = dump_memory_writes;
          iVar19 = dump_memory_reads;
          iVar20 = info;
          iVar21 = dump_raw_ioctl_data;
          iVar22 = dump_sys_mmap_details;
          iVar23 = print_gpu_addresses;
          if (en == 0) {
            dump_raw_ioctl_data = 0;
            iVar26 = en;
            iVar17 = en;
            iVar21 = dump_raw_ioctl_data;
          }
        }
        else {
          iVar25 = strcmp(__s1,"tsc");
          iVar26 = dump_decoded_ioctl_data;
          iVar1 = en;
          iVar2 = dump_tic;
          iVar3 = dump_vp;
          iVar4 = dump_fp;
          iVar5 = dump_gp;
          iVar6 = dump_cp;
          iVar7 = dump_tep;
          iVar8 = dump_tcp;
          iVar9 = dump_buffer_usage;
          iVar10 = decode_pb;
          iVar11 = dump_sys_mmap;
          iVar12 = dump_sys_munmap;
          iVar13 = dump_sys_mremap;
          iVar14 = dump_sys_open;
          iVar15 = dump_msg;
          iVar16 = dump_sys_write;
          iVar17 = dump_object_tree_on_create_destroy;
          iVar18 = dump_memory_writes;
          iVar19 = dump_memory_reads;
          iVar20 = info;
          iVar21 = dump_raw_ioctl_data;
          iVar22 = dump_sys_mmap_details;
          iVar23 = print_gpu_addresses;
          if ((((iVar25 != 0) &&
               (iVar25 = strcmp(__s1,"tic"), iVar26 = dump_decoded_ioctl_data, iVar1 = dump_tsc,
               iVar2 = en, iVar3 = dump_vp, iVar4 = dump_fp, iVar5 = dump_gp, iVar6 = dump_cp,
               iVar7 = dump_tep, iVar8 = dump_tcp, iVar9 = dump_buffer_usage, iVar10 = decode_pb,
               iVar11 = dump_sys_mmap, iVar12 = dump_sys_munmap, iVar13 = dump_sys_mremap,
               iVar14 = dump_sys_open, iVar15 = dump_msg, iVar16 = dump_sys_write,
               iVar17 = dump_object_tree_on_create_destroy, iVar18 = dump_memory_writes,
               iVar19 = dump_memory_reads, iVar20 = info, iVar21 = dump_raw_ioctl_data,
               iVar22 = dump_sys_mmap_details, iVar23 = print_gpu_addresses, iVar25 != 0)) &&
              ((iVar25 = strcmp(__s1,"vp"), iVar26 = dump_decoded_ioctl_data, iVar1 = dump_tsc,
               iVar2 = dump_tic, iVar3 = en, iVar4 = dump_fp, iVar5 = dump_gp, iVar6 = dump_cp,
               iVar7 = dump_tep, iVar8 = dump_tcp, iVar9 = dump_buffer_usage, iVar10 = decode_pb,
               iVar11 = dump_sys_mmap, iVar12 = dump_sys_munmap, iVar13 = dump_sys_mremap,
               iVar14 = dump_sys_open, iVar15 = dump_msg, iVar16 = dump_sys_write,
               iVar17 = dump_object_tree_on_create_destroy, iVar18 = dump_memory_writes,
               iVar19 = dump_memory_reads, iVar20 = info, iVar21 = dump_raw_ioctl_data,
               iVar22 = dump_sys_mmap_details, iVar23 = print_gpu_addresses, iVar25 != 0 &&
               ((((iVar25 = strcmp(__s1,"fp"), iVar26 = dump_decoded_ioctl_data, iVar1 = dump_tsc,
                  iVar2 = dump_tic, iVar3 = dump_vp, iVar4 = en, iVar5 = dump_gp, iVar6 = dump_cp,
                  iVar7 = dump_tep, iVar8 = dump_tcp, iVar9 = dump_buffer_usage, iVar10 = decode_pb,
                  iVar11 = dump_sys_mmap, iVar12 = dump_sys_munmap, iVar13 = dump_sys_mremap,
                  iVar14 = dump_sys_open, iVar15 = dump_msg, iVar16 = dump_sys_write,
                  iVar17 = dump_object_tree_on_create_destroy, iVar18 = dump_memory_writes,
                  iVar19 = dump_memory_reads, iVar20 = info, iVar21 = dump_raw_ioctl_data,
                  iVar22 = dump_sys_mmap_details, iVar23 = print_gpu_addresses, iVar25 != 0 &&
                  (iVar25 = strcmp(__s1,"gp"), iVar26 = dump_decoded_ioctl_data, iVar1 = dump_tsc,
                  iVar2 = dump_tic, iVar3 = dump_vp, iVar4 = dump_fp, iVar5 = en, iVar6 = dump_cp,
                  iVar7 = dump_tep, iVar8 = dump_tcp, iVar9 = dump_buffer_usage, iVar10 = decode_pb,
                  iVar11 = dump_sys_mmap, iVar12 = dump_sys_munmap, iVar13 = dump_sys_mremap,
                  iVar14 = dump_sys_open, iVar15 = dump_msg, iVar16 = dump_sys_write,
                  iVar17 = dump_object_tree_on_create_destroy, iVar18 = dump_memory_writes,
                  iVar19 = dump_memory_reads, iVar20 = info, iVar21 = dump_raw_ioctl_data,
                  iVar22 = dump_sys_mmap_details, iVar23 = print_gpu_addresses, iVar25 != 0)) &&
                 (iVar25 = strcmp(__s1,"cp"), iVar26 = dump_decoded_ioctl_data, iVar1 = dump_tsc,
                 iVar2 = dump_tic, iVar3 = dump_vp, iVar4 = dump_fp, iVar5 = dump_gp, iVar6 = en,
                 iVar7 = dump_tep, iVar8 = dump_tcp, iVar9 = dump_buffer_usage, iVar10 = decode_pb,
                 iVar11 = dump_sys_mmap, iVar12 = dump_sys_munmap, iVar13 = dump_sys_mremap,
                 iVar14 = dump_sys_open, iVar15 = dump_msg, iVar16 = dump_sys_write,
                 iVar17 = dump_object_tree_on_create_destroy, iVar18 = dump_memory_writes,
                 iVar19 = dump_memory_reads, iVar20 = info, iVar21 = dump_raw_ioctl_data,
                 iVar22 = dump_sys_mmap_details, iVar23 = print_gpu_addresses, iVar25 != 0)) &&
                ((iVar25 = strcmp(__s1,"tep"), iVar26 = dump_decoded_ioctl_data, iVar1 = dump_tsc,
                 iVar2 = dump_tic, iVar3 = dump_vp, iVar4 = dump_fp, iVar5 = dump_gp,
                 iVar6 = dump_cp, iVar7 = en, iVar8 = dump_tcp, iVar9 = dump_buffer_usage,
                 iVar10 = decode_pb, iVar11 = dump_sys_mmap, iVar12 = dump_sys_munmap,
                 iVar13 = dump_sys_mremap, iVar14 = dump_sys_open, iVar15 = dump_msg,
                 iVar16 = dump_sys_write, iVar17 = dump_object_tree_on_create_destroy,
                 iVar18 = dump_memory_writes, iVar19 = dump_memory_reads, iVar20 = info,
                 iVar21 = dump_raw_ioctl_data, iVar22 = dump_sys_mmap_details,
                 iVar23 = print_gpu_addresses, iVar25 != 0 &&
                 (iVar25 = strcmp(__s1,"tcp"), iVar26 = dump_decoded_ioctl_data, iVar1 = dump_tsc,
                 iVar2 = dump_tic, iVar3 = dump_vp, iVar4 = dump_fp, iVar5 = dump_gp,
                 iVar6 = dump_cp, iVar7 = dump_tep, iVar8 = en, iVar9 = dump_buffer_usage,
                 iVar10 = decode_pb, iVar11 = dump_sys_mmap, iVar12 = dump_sys_munmap,
                 iVar13 = dump_sys_mremap, iVar14 = dump_sys_open, iVar15 = dump_msg,
                 iVar16 = dump_sys_write, iVar17 = dump_object_tree_on_create_destroy,
                 iVar18 = dump_memory_writes, iVar19 = dump_memory_reads, iVar20 = info,
                 iVar21 = dump_raw_ioctl_data, iVar22 = dump_sys_mmap_details,
                 iVar23 = print_gpu_addresses, iVar25 != 0)))))))) &&
             (iVar25 = strcmp(__s1,"shader"), iVar26 = dump_decoded_ioctl_data, iVar1 = dump_tsc,
             iVar2 = dump_tic, iVar3 = en, iVar4 = en, iVar5 = en, iVar6 = dump_cp, iVar7 = en,
             iVar8 = en, iVar9 = dump_buffer_usage, iVar10 = decode_pb, iVar11 = dump_sys_mmap,
             iVar12 = dump_sys_munmap, iVar13 = dump_sys_mremap, iVar14 = dump_sys_open,
             iVar15 = dump_msg, iVar16 = dump_sys_write, iVar17 = dump_object_tree_on_create_destroy
             , iVar18 = dump_memory_writes, iVar19 = dump_memory_reads, iVar20 = info,
             iVar21 = dump_raw_ioctl_data, iVar22 = dump_sys_mmap_details,
             iVar23 = print_gpu_addresses, iVar25 != 0)) {
            iVar26 = strcmp(__s1,"macro-rt-verbose");
            if (iVar26 == 0) {
              piVar29 = &macro_rt_verbose;
            }
            else {
              iVar26 = strcmp(__s1,"macro-rt");
              if (iVar26 == 0) {
                piVar29 = &macro_rt;
              }
              else {
                iVar26 = strcmp(__s1,"macro-dis");
                if (iVar26 != 0) {
                  iVar26 = strcmp(__s1,"macro");
                  if (iVar26 != 0) {
                    iVar25 = strcmp(__s1,"buffer-usage");
                    iVar26 = dump_decoded_ioctl_data;
                    iVar1 = dump_tsc;
                    iVar2 = dump_tic;
                    iVar3 = dump_vp;
                    iVar4 = dump_fp;
                    iVar5 = dump_gp;
                    iVar6 = dump_cp;
                    iVar7 = dump_tep;
                    iVar8 = dump_tcp;
                    iVar9 = en;
                    iVar10 = decode_pb;
                    iVar11 = dump_sys_mmap;
                    iVar12 = dump_sys_munmap;
                    iVar13 = dump_sys_mremap;
                    iVar14 = dump_sys_open;
                    iVar15 = dump_msg;
                    iVar16 = dump_sys_write;
                    iVar17 = dump_object_tree_on_create_destroy;
                    iVar18 = dump_memory_writes;
                    iVar19 = dump_memory_reads;
                    iVar20 = info;
                    iVar21 = dump_raw_ioctl_data;
                    iVar22 = dump_sys_mmap_details;
                    iVar23 = print_gpu_addresses;
                    if (iVar25 != 0) {
                      iVar26 = strncmp(__s1,"class=",6);
                      if (iVar26 == 0) {
                        iVar26 = strcmp(__s1 + 6,"all");
                        if (iVar26 == 0) {
                          iVar26 = dump_decoded_ioctl_data;
                          iVar1 = dump_tsc;
                          iVar2 = dump_tic;
                          iVar3 = dump_vp;
                          iVar4 = dump_fp;
                          iVar5 = dump_gp;
                          iVar6 = dump_cp;
                          iVar7 = dump_tep;
                          iVar8 = dump_tcp;
                          iVar9 = dump_buffer_usage;
                          iVar10 = decode_pb;
                          iVar11 = dump_sys_mmap;
                          iVar12 = dump_sys_munmap;
                          iVar13 = dump_sys_mremap;
                          iVar14 = dump_sys_open;
                          iVar15 = dump_msg;
                          iVar16 = dump_sys_write;
                          iVar17 = dump_object_tree_on_create_destroy;
                          iVar18 = dump_memory_writes;
                          iVar19 = dump_memory_reads;
                          iVar20 = info;
                          iVar21 = dump_raw_ioctl_data;
                          iVar22 = dump_sys_mmap_details;
                          iVar23 = print_gpu_addresses;
                          if (obj_decoders[0].class_ != 0) {
                            pgVar27 = obj_decoders;
                            do {
                              pgVar27 = pgVar27 + 1;
                              pgVar27[-1].disabled = uVar24;
                              iVar26 = dump_decoded_ioctl_data;
                              iVar1 = dump_tsc;
                              iVar2 = dump_tic;
                              iVar3 = dump_vp;
                              iVar4 = dump_fp;
                              iVar5 = dump_gp;
                              iVar6 = dump_cp;
                              iVar7 = dump_tep;
                              iVar8 = dump_tcp;
                              iVar9 = dump_buffer_usage;
                              iVar10 = decode_pb;
                              iVar11 = dump_sys_mmap;
                              iVar12 = dump_sys_munmap;
                              iVar13 = dump_sys_mremap;
                              iVar14 = dump_sys_open;
                              iVar15 = dump_msg;
                              iVar16 = dump_sys_write;
                              iVar17 = dump_object_tree_on_create_destroy;
                              iVar18 = dump_memory_writes;
                              iVar19 = dump_memory_reads;
                              iVar20 = info;
                              iVar21 = dump_raw_ioctl_data;
                              iVar22 = dump_sys_mmap_details;
                              iVar23 = print_gpu_addresses;
                            } while (pgVar27->class_ != 0);
                          }
                        }
                        else {
                          _filter_class(__s1 + 6,en);
                          iVar26 = dump_decoded_ioctl_data;
                          iVar1 = dump_tsc;
                          iVar2 = dump_tic;
                          iVar3 = dump_vp;
                          iVar4 = dump_fp;
                          iVar5 = dump_gp;
                          iVar6 = dump_cp;
                          iVar7 = dump_tep;
                          iVar8 = dump_tcp;
                          iVar9 = dump_buffer_usage;
                          iVar10 = decode_pb;
                          iVar11 = dump_sys_mmap;
                          iVar12 = dump_sys_munmap;
                          iVar13 = dump_sys_mremap;
                          iVar14 = dump_sys_open;
                          iVar15 = dump_msg;
                          iVar16 = dump_sys_write;
                          iVar17 = dump_object_tree_on_create_destroy;
                          iVar18 = dump_memory_writes;
                          iVar19 = dump_memory_reads;
                          iVar20 = info;
                          iVar21 = dump_raw_ioctl_data;
                          iVar22 = dump_sys_mmap_details;
                          iVar23 = print_gpu_addresses;
                        }
                      }
                      else {
                        iVar25 = strcmp(__s1,"pb");
                        iVar26 = dump_decoded_ioctl_data;
                        iVar1 = dump_tsc;
                        iVar2 = dump_tic;
                        iVar3 = dump_vp;
                        iVar4 = dump_fp;
                        iVar5 = dump_gp;
                        iVar6 = dump_cp;
                        iVar7 = dump_tep;
                        iVar8 = dump_tcp;
                        iVar9 = dump_buffer_usage;
                        iVar10 = en;
                        iVar11 = dump_sys_mmap;
                        iVar12 = dump_sys_munmap;
                        iVar13 = dump_sys_mremap;
                        iVar14 = dump_sys_open;
                        iVar15 = dump_msg;
                        iVar16 = dump_sys_write;
                        iVar17 = dump_object_tree_on_create_destroy;
                        iVar18 = dump_memory_writes;
                        iVar19 = dump_memory_reads;
                        iVar20 = info;
                        iVar21 = dump_raw_ioctl_data;
                        iVar22 = dump_sys_mmap_details;
                        iVar23 = print_gpu_addresses;
                        if (((iVar25 != 0) &&
                            (iVar25 = strcmp(__s1,"sys_mmap"), iVar26 = dump_decoded_ioctl_data,
                            iVar1 = dump_tsc, iVar2 = dump_tic, iVar3 = dump_vp, iVar4 = dump_fp,
                            iVar5 = dump_gp, iVar6 = dump_cp, iVar7 = dump_tep, iVar8 = dump_tcp,
                            iVar9 = dump_buffer_usage, iVar10 = decode_pb, iVar11 = en,
                            iVar12 = dump_sys_munmap, iVar13 = dump_sys_mremap,
                            iVar14 = dump_sys_open, iVar15 = dump_msg, iVar16 = dump_sys_write,
                            iVar17 = dump_object_tree_on_create_destroy, iVar18 = dump_memory_writes
                            , iVar19 = dump_memory_reads, iVar20 = info,
                            iVar21 = dump_raw_ioctl_data, iVar22 = dump_sys_mmap_details,
                            iVar23 = print_gpu_addresses, iVar25 != 0)) &&
                           (((iVar25 = strcmp(__s1,"sys_mmap_details"),
                             iVar26 = dump_decoded_ioctl_data, iVar1 = dump_tsc, iVar2 = dump_tic,
                             iVar3 = dump_vp, iVar4 = dump_fp, iVar5 = dump_gp, iVar6 = dump_cp,
                             iVar7 = dump_tep, iVar8 = dump_tcp, iVar9 = dump_buffer_usage,
                             iVar10 = decode_pb, iVar11 = dump_sys_mmap, iVar12 = dump_sys_munmap,
                             iVar13 = dump_sys_mremap, iVar14 = dump_sys_open, iVar15 = dump_msg,
                             iVar16 = dump_sys_write, iVar17 = dump_object_tree_on_create_destroy,
                             iVar18 = dump_memory_writes, iVar19 = dump_memory_reads, iVar20 = info,
                             iVar21 = dump_raw_ioctl_data, iVar22 = en, iVar23 = print_gpu_addresses
                             , iVar25 != 0 &&
                             (((iVar25 = strcmp(__s1,"sys_munmap"), iVar26 = dump_decoded_ioctl_data
                               , iVar1 = dump_tsc, iVar2 = dump_tic, iVar3 = dump_vp,
                               iVar4 = dump_fp, iVar5 = dump_gp, iVar6 = dump_cp, iVar7 = dump_tep,
                               iVar8 = dump_tcp, iVar9 = dump_buffer_usage, iVar10 = decode_pb,
                               iVar11 = dump_sys_mmap, iVar12 = en, iVar13 = dump_sys_mremap,
                               iVar14 = dump_sys_open, iVar15 = dump_msg, iVar16 = dump_sys_write,
                               iVar17 = dump_object_tree_on_create_destroy,
                               iVar18 = dump_memory_writes, iVar19 = dump_memory_reads,
                               iVar20 = info, iVar21 = dump_raw_ioctl_data,
                               iVar22 = dump_sys_mmap_details, iVar23 = print_gpu_addresses,
                               iVar25 != 0 &&
                               (iVar25 = strcmp(__s1,"sys_mremap"), iVar26 = dump_decoded_ioctl_data
                               , iVar1 = dump_tsc, iVar2 = dump_tic, iVar3 = dump_vp,
                               iVar4 = dump_fp, iVar5 = dump_gp, iVar6 = dump_cp, iVar7 = dump_tep,
                               iVar8 = dump_tcp, iVar9 = dump_buffer_usage, iVar10 = decode_pb,
                               iVar11 = dump_sys_mmap, iVar12 = dump_sys_munmap, iVar13 = en,
                               iVar14 = dump_sys_open, iVar15 = dump_msg, iVar16 = dump_sys_write,
                               iVar17 = dump_object_tree_on_create_destroy,
                               iVar18 = dump_memory_writes, iVar19 = dump_memory_reads,
                               iVar20 = info, iVar21 = dump_raw_ioctl_data,
                               iVar22 = dump_sys_mmap_details, iVar23 = print_gpu_addresses,
                               iVar25 != 0)) &&
                              (iVar25 = strcmp(__s1,"sys_open"), iVar26 = dump_decoded_ioctl_data,
                              iVar1 = dump_tsc, iVar2 = dump_tic, iVar3 = dump_vp, iVar4 = dump_fp,
                              iVar5 = dump_gp, iVar6 = dump_cp, iVar7 = dump_tep, iVar8 = dump_tcp,
                              iVar9 = dump_buffer_usage, iVar10 = decode_pb, iVar11 = dump_sys_mmap,
                              iVar12 = dump_sys_munmap, iVar13 = dump_sys_mremap, iVar14 = en,
                              iVar15 = dump_msg, iVar16 = dump_sys_write,
                              iVar17 = dump_object_tree_on_create_destroy,
                              iVar18 = dump_memory_writes, iVar19 = dump_memory_reads, iVar20 = info
                              , iVar21 = dump_raw_ioctl_data, iVar22 = dump_sys_mmap_details,
                              iVar23 = print_gpu_addresses, iVar25 != 0)))) &&
                            ((iVar25 = strcmp(__s1,"msg"), iVar26 = dump_decoded_ioctl_data,
                             iVar1 = dump_tsc, iVar2 = dump_tic, iVar3 = dump_vp, iVar4 = dump_fp,
                             iVar5 = dump_gp, iVar6 = dump_cp, iVar7 = dump_tep, iVar8 = dump_tcp,
                             iVar9 = dump_buffer_usage, iVar10 = decode_pb, iVar11 = dump_sys_mmap,
                             iVar12 = dump_sys_munmap, iVar13 = dump_sys_mremap,
                             iVar14 = dump_sys_open, iVar15 = en, iVar16 = dump_sys_write,
                             iVar17 = dump_object_tree_on_create_destroy,
                             iVar18 = dump_memory_writes, iVar19 = dump_memory_reads, iVar20 = info,
                             iVar21 = dump_raw_ioctl_data, iVar22 = dump_sys_mmap_details,
                             iVar23 = print_gpu_addresses, iVar25 != 0 &&
                             (iVar25 = strcmp(__s1,"sys_write"), iVar26 = dump_decoded_ioctl_data,
                             iVar1 = dump_tsc, iVar2 = dump_tic, iVar3 = dump_vp, iVar4 = dump_fp,
                             iVar5 = dump_gp, iVar6 = dump_cp, iVar7 = dump_tep, iVar8 = dump_tcp,
                             iVar9 = dump_buffer_usage, iVar10 = decode_pb, iVar11 = dump_sys_mmap,
                             iVar12 = dump_sys_munmap, iVar13 = dump_sys_mremap,
                             iVar14 = dump_sys_open, iVar15 = dump_msg, iVar16 = en,
                             iVar17 = dump_object_tree_on_create_destroy,
                             iVar18 = dump_memory_writes, iVar19 = dump_memory_reads, iVar20 = info,
                             iVar21 = dump_raw_ioctl_data, iVar22 = dump_sys_mmap_details,
                             iVar23 = print_gpu_addresses, iVar25 != 0)))))) {
                          iVar26 = strcmp(__s1,"sys");
                          if (iVar26 != 0) {
                            iVar26 = strcmp(__s1,"nvrm-handle-desc");
                            if (iVar26 == 0) {
                              piVar29 = &nvrm_describe_handles;
                            }
                            else {
                              iVar26 = strcmp(__s1,"nvrm-class-desc");
                              if (iVar26 != 0) {
                                iVar26 = strncmp(__s1,"nvrm-mthd=",10);
                                if (iVar26 == 0) {
                                  iVar26 = strcmp(__s1 + 10,"all");
                                  if (iVar26 == 0) {
                                    lVar28 = (long)nvrm_mthds_cnt;
                                    if (0 < lVar28) {
                                      lVar30 = 0;
                                      do {
                                        *(uint *)((long)&nvrm_mthds[0].disabled + lVar30) = uVar24;
                                        lVar30 = lVar30 + 0x30;
                                      } while (lVar28 * 0x30 != lVar30);
                                    }
                                  }
                                  else {
                                    _filter_nvrm_mthd(__s1 + 10,en);
                                  }
                                  iVar26 = dump_decoded_ioctl_data;
                                  iVar1 = dump_tsc;
                                  iVar2 = dump_tic;
                                  iVar3 = dump_vp;
                                  iVar4 = dump_fp;
                                  iVar5 = dump_gp;
                                  iVar6 = dump_cp;
                                  iVar7 = dump_tep;
                                  iVar8 = dump_tcp;
                                  iVar9 = dump_buffer_usage;
                                  iVar10 = decode_pb;
                                  iVar11 = dump_sys_mmap;
                                  iVar12 = dump_sys_munmap;
                                  iVar13 = dump_sys_mremap;
                                  iVar14 = dump_sys_open;
                                  iVar15 = dump_msg;
                                  iVar16 = dump_sys_write;
                                  iVar17 = dump_object_tree_on_create_destroy;
                                  iVar18 = dump_memory_writes;
                                  iVar19 = dump_memory_reads;
                                  iVar20 = info;
                                  iVar21 = dump_raw_ioctl_data;
                                  iVar22 = dump_sys_mmap_details;
                                  iVar23 = print_gpu_addresses;
                                  if (en != 0) {
                                    _filter_nvrm_ioctl("call",1);
LAB_002466f1:
                                    dump_decoded_ioctl_data = 1;
                                    iVar26 = dump_decoded_ioctl_data;
                                    iVar1 = dump_tsc;
                                    iVar2 = dump_tic;
                                    iVar3 = dump_vp;
                                    iVar4 = dump_fp;
                                    iVar5 = dump_gp;
                                    iVar6 = dump_cp;
                                    iVar7 = dump_tep;
                                    iVar8 = dump_tcp;
                                    iVar9 = dump_buffer_usage;
                                    iVar10 = decode_pb;
                                    iVar11 = dump_sys_mmap;
                                    iVar12 = dump_sys_munmap;
                                    iVar13 = dump_sys_mremap;
                                    iVar14 = dump_sys_open;
                                    iVar15 = dump_msg;
                                    iVar16 = dump_sys_write;
                                    iVar17 = dump_object_tree_on_create_destroy;
                                    iVar18 = dump_memory_writes;
                                    iVar19 = dump_memory_reads;
                                    iVar20 = info;
                                    iVar21 = dump_raw_ioctl_data;
                                    iVar22 = dump_sys_mmap_details;
                                    iVar23 = print_gpu_addresses;
                                  }
                                }
                                else {
                                  iVar26 = strcmp(__s1,"nvrm-unk-0-fields");
                                  if (iVar26 == 0) {
                                    piVar29 = &nvrm_show_unk_zero_fields;
                                    goto LAB_0024645f;
                                  }
                                  iVar26 = strncmp(__s1,"nvrm-ioctl=",0xb);
                                  if (iVar26 == 0) {
                                    iVar26 = strcmp(__s1 + 0xb,"all");
                                    if (iVar26 == 0) {
                                      lVar28 = (long)nvrm_ioctls_cnt;
                                      if (0 < lVar28) {
                                        lVar30 = 0;
                                        do {
                                          *(uint *)((long)&nvrm_ioctls[0].disabled + lVar30) =
                                               uVar24;
                                          lVar30 = lVar30 + 0x30;
                                        } while (lVar28 * 0x30 != lVar30);
                                      }
                                    }
                                    else {
                                      _filter_nvrm_ioctl(__s1 + 0xb,en);
                                    }
                                    iVar26 = dump_decoded_ioctl_data;
                                    iVar1 = dump_tsc;
                                    iVar2 = dump_tic;
                                    iVar3 = dump_vp;
                                    iVar4 = dump_fp;
                                    iVar5 = dump_gp;
                                    iVar6 = dump_cp;
                                    iVar7 = dump_tep;
                                    iVar8 = dump_tcp;
                                    iVar9 = dump_buffer_usage;
                                    iVar10 = decode_pb;
                                    iVar11 = dump_sys_mmap;
                                    iVar12 = dump_sys_munmap;
                                    iVar13 = dump_sys_mremap;
                                    iVar14 = dump_sys_open;
                                    iVar15 = dump_msg;
                                    iVar16 = dump_sys_write;
                                    iVar17 = dump_object_tree_on_create_destroy;
                                    iVar18 = dump_memory_writes;
                                    iVar19 = dump_memory_reads;
                                    iVar20 = info;
                                    iVar21 = dump_raw_ioctl_data;
                                    iVar22 = dump_sys_mmap_details;
                                    iVar23 = print_gpu_addresses;
                                    if (en != 0) goto LAB_002466f1;
                                  }
                                  else {
                                    iVar25 = strcmp(__s1,"nvrm-obj-tree");
                                    iVar26 = dump_decoded_ioctl_data;
                                    iVar1 = dump_tsc;
                                    iVar2 = dump_tic;
                                    iVar3 = dump_vp;
                                    iVar4 = dump_fp;
                                    iVar5 = dump_gp;
                                    iVar6 = dump_cp;
                                    iVar7 = dump_tep;
                                    iVar8 = dump_tcp;
                                    iVar9 = dump_buffer_usage;
                                    iVar10 = decode_pb;
                                    iVar11 = dump_sys_mmap;
                                    iVar12 = dump_sys_munmap;
                                    iVar13 = dump_sys_mremap;
                                    iVar14 = dump_sys_open;
                                    iVar15 = dump_msg;
                                    iVar16 = dump_sys_write;
                                    iVar17 = en;
                                    iVar18 = dump_memory_writes;
                                    iVar19 = dump_memory_reads;
                                    iVar20 = info;
                                    iVar21 = dump_raw_ioctl_data;
                                    iVar22 = dump_sys_mmap_details;
                                    iVar23 = print_gpu_addresses;
                                    if (iVar25 != 0) {
                                      iVar26 = strcmp(__s1,"nvrm");
                                      if (iVar26 == 0) {
                                        if (en != 0) {
                                          dump_decoded_ioctl_data = 1;
                                        }
                                        lVar28 = (long)nvrm_ioctls_cnt;
                                        if (0 < lVar28) {
                                          lVar30 = 0;
                                          do {
                                            *(uint *)((long)&nvrm_ioctls[0].disabled + lVar30) =
                                                 uVar24;
                                            lVar30 = lVar30 + 0x30;
                                          } while (lVar28 * 0x30 != lVar30);
                                        }
                                        lVar28 = (long)nvrm_mthds_cnt;
                                        iVar26 = dump_decoded_ioctl_data;
                                        iVar1 = dump_tsc;
                                        iVar2 = dump_tic;
                                        iVar3 = dump_vp;
                                        iVar4 = dump_fp;
                                        iVar5 = dump_gp;
                                        iVar6 = dump_cp;
                                        iVar7 = dump_tep;
                                        iVar8 = dump_tcp;
                                        iVar9 = dump_buffer_usage;
                                        iVar10 = decode_pb;
                                        iVar11 = dump_sys_mmap;
                                        iVar12 = dump_sys_munmap;
                                        iVar13 = dump_sys_mremap;
                                        iVar14 = dump_sys_open;
                                        iVar15 = dump_msg;
                                        iVar16 = dump_sys_write;
                                        iVar17 = en;
                                        iVar18 = dump_memory_writes;
                                        iVar19 = dump_memory_reads;
                                        iVar20 = info;
                                        nvrm_describe_classes = en;
                                        nvrm_describe_handles = en;
                                        iVar21 = dump_raw_ioctl_data;
                                        iVar22 = dump_sys_mmap_details;
                                        iVar23 = print_gpu_addresses;
                                        if (0 < lVar28) {
                                          lVar30 = 0;
                                          do {
                                            *(uint *)((long)&nvrm_mthds[0].disabled + lVar30) =
                                                 uVar24;
                                            lVar30 = lVar30 + 0x30;
                                            iVar26 = dump_decoded_ioctl_data;
                                            iVar1 = dump_tsc;
                                            iVar2 = dump_tic;
                                            iVar3 = dump_vp;
                                            iVar4 = dump_fp;
                                            iVar5 = dump_gp;
                                            iVar6 = dump_cp;
                                            iVar7 = dump_tep;
                                            iVar8 = dump_tcp;
                                            iVar9 = dump_buffer_usage;
                                            iVar10 = decode_pb;
                                            iVar11 = dump_sys_mmap;
                                            iVar12 = dump_sys_munmap;
                                            iVar13 = dump_sys_mremap;
                                            iVar14 = dump_sys_open;
                                            iVar15 = dump_msg;
                                            iVar16 = dump_sys_write;
                                            iVar17 = en;
                                            iVar18 = dump_memory_writes;
                                            iVar19 = dump_memory_reads;
                                            iVar20 = info;
                                            iVar21 = dump_raw_ioctl_data;
                                            iVar22 = dump_sys_mmap_details;
                                            iVar23 = print_gpu_addresses;
                                          } while (lVar28 * 0x30 != lVar30);
                                        }
                                      }
                                      else {
                                        iVar25 = strcmp(__s1,"info");
                                        iVar26 = dump_decoded_ioctl_data;
                                        iVar1 = dump_tsc;
                                        iVar2 = dump_tic;
                                        iVar3 = dump_vp;
                                        iVar4 = dump_fp;
                                        iVar5 = dump_gp;
                                        iVar6 = dump_cp;
                                        iVar7 = dump_tep;
                                        iVar8 = dump_tcp;
                                        iVar9 = dump_buffer_usage;
                                        iVar10 = decode_pb;
                                        iVar11 = dump_sys_mmap;
                                        iVar12 = dump_sys_munmap;
                                        iVar13 = dump_sys_mremap;
                                        iVar14 = dump_sys_open;
                                        iVar15 = dump_msg;
                                        iVar16 = dump_sys_write;
                                        iVar17 = dump_object_tree_on_create_destroy;
                                        iVar18 = dump_memory_writes;
                                        iVar19 = dump_memory_reads;
                                        iVar20 = en;
                                        iVar21 = dump_raw_ioctl_data;
                                        iVar22 = dump_sys_mmap_details;
                                        iVar23 = print_gpu_addresses;
                                        if (iVar25 != 0) {
                                          iVar26 = strcmp(__s1,"all");
                                          if (iVar26 != 0) {
                                            handle_filter_opt_cold_1();
                                          }
                                          dump_decoded_ioctl_data = en;
                                          dump_tsc = en;
                                          dump_tic = en;
                                          dump_vp = en;
                                          dump_fp = en;
                                          dump_gp = en;
                                          dump_cp = en;
                                          dump_tep = en;
                                          dump_tcp = en;
                                          dump_buffer_usage = en;
                                          dump_memory_writes = en;
                                          dump_memory_reads = en;
                                          info = en;
                                          macro_rt = en;
                                          macro_dis_enabled = en;
                                          dump_raw_ioctl_data = en;
                                          print_gpu_addresses = en;
                                          macro_rt_verbose = en;
                                          if (obj_decoders[0].class_ != 0) {
                                            pgVar27 = obj_decoders;
                                            do {
                                              pgVar27 = pgVar27 + 1;
                                              pgVar27[-1].disabled = uVar24;
                                            } while (pgVar27->class_ != 0);
                                          }
                                          lVar28 = (long)nvrm_mthds_cnt;
                                          decode_pb = en;
                                          dump_sys_mmap = en;
                                          dump_sys_munmap = en;
                                          dump_sys_mremap = en;
                                          dump_sys_open = en;
                                          dump_msg = en;
                                          dump_sys_write = en;
                                          nvrm_describe_classes = en;
                                          nvrm_describe_handles = en;
                                          dump_sys_mmap_details = en;
                                          if (0 < lVar28) {
                                            lVar30 = 0;
                                            do {
                                              *(uint *)((long)&nvrm_mthds[0].disabled + lVar30) =
                                                   uVar24;
                                              lVar30 = lVar30 + 0x30;
                                            } while (lVar28 * 0x30 != lVar30);
                                          }
                                          lVar28 = (long)nvrm_ioctls_cnt;
                                          iVar26 = dump_decoded_ioctl_data;
                                          iVar1 = dump_tsc;
                                          iVar2 = dump_tic;
                                          iVar3 = dump_vp;
                                          iVar4 = dump_fp;
                                          iVar5 = dump_gp;
                                          iVar6 = dump_cp;
                                          iVar7 = dump_tep;
                                          iVar8 = dump_tcp;
                                          iVar9 = dump_buffer_usage;
                                          iVar10 = decode_pb;
                                          iVar11 = dump_sys_mmap;
                                          iVar12 = dump_sys_munmap;
                                          iVar13 = dump_sys_mremap;
                                          iVar14 = dump_sys_open;
                                          iVar15 = dump_msg;
                                          iVar16 = dump_sys_write;
                                          iVar17 = en;
                                          iVar18 = dump_memory_writes;
                                          iVar19 = dump_memory_reads;
                                          iVar20 = info;
                                          nvrm_show_unk_zero_fields = en;
                                          iVar21 = dump_raw_ioctl_data;
                                          iVar22 = dump_sys_mmap_details;
                                          iVar23 = print_gpu_addresses;
                                          if (0 < lVar28) {
                                            lVar30 = 0;
                                            do {
                                              *(uint *)((long)&nvrm_ioctls[0].disabled + lVar30) =
                                                   uVar24;
                                              lVar30 = lVar30 + 0x30;
                                              iVar26 = dump_decoded_ioctl_data;
                                              iVar1 = dump_tsc;
                                              iVar2 = dump_tic;
                                              iVar3 = dump_vp;
                                              iVar4 = dump_fp;
                                              iVar5 = dump_gp;
                                              iVar6 = dump_cp;
                                              iVar7 = dump_tep;
                                              iVar8 = dump_tcp;
                                              iVar9 = dump_buffer_usage;
                                              iVar10 = decode_pb;
                                              iVar11 = dump_sys_mmap;
                                              iVar12 = dump_sys_munmap;
                                              iVar13 = dump_sys_mremap;
                                              iVar14 = dump_sys_open;
                                              iVar15 = dump_msg;
                                              iVar16 = dump_sys_write;
                                              iVar17 = en;
                                              iVar18 = dump_memory_writes;
                                              iVar19 = dump_memory_reads;
                                              iVar20 = info;
                                              iVar21 = dump_raw_ioctl_data;
                                              iVar22 = dump_sys_mmap_details;
                                              iVar23 = print_gpu_addresses;
                                            } while (lVar28 * 0x30 != lVar30);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                                goto LAB_00246394;
                              }
                              piVar29 = &nvrm_describe_classes;
                            }
                            goto LAB_0024645f;
                          }
                          iVar26 = en;
                          iVar1 = dump_tsc;
                          iVar2 = dump_tic;
                          iVar3 = dump_vp;
                          iVar4 = dump_fp;
                          iVar5 = dump_gp;
                          iVar6 = dump_cp;
                          iVar7 = dump_tep;
                          iVar8 = dump_tcp;
                          iVar9 = dump_buffer_usage;
                          iVar10 = decode_pb;
                          iVar11 = en;
                          iVar12 = en;
                          iVar13 = en;
                          iVar14 = en;
                          iVar15 = dump_msg;
                          iVar16 = en;
                          iVar17 = en;
                          iVar18 = dump_memory_writes;
                          iVar19 = dump_memory_reads;
                          iVar20 = info;
                          iVar21 = dump_raw_ioctl_data;
                          iVar22 = dump_sys_mmap_details;
                          iVar23 = print_gpu_addresses;
                          if (en == 0) {
                            dump_sys_mmap_details = 0;
                            dump_raw_ioctl_data = 0;
                            iVar26 = en;
                            iVar11 = en;
                            iVar12 = en;
                            iVar13 = en;
                            iVar14 = en;
                            iVar16 = en;
                            iVar17 = en;
                            iVar21 = dump_raw_ioctl_data;
                            iVar22 = dump_sys_mmap_details;
                          }
                        }
                      }
                    }
                    goto LAB_00246394;
                  }
                  macro_rt = en;
                  if (en == 0) {
                    macro_rt_verbose = 0;
                  }
                }
                piVar29 = &macro_dis_enabled;
              }
            }
LAB_0024645f:
            *piVar29 = en;
            iVar26 = dump_decoded_ioctl_data;
            iVar1 = dump_tsc;
            iVar2 = dump_tic;
            iVar3 = dump_vp;
            iVar4 = dump_fp;
            iVar5 = dump_gp;
            iVar6 = dump_cp;
            iVar7 = dump_tep;
            iVar8 = dump_tcp;
            iVar9 = dump_buffer_usage;
            iVar10 = decode_pb;
            iVar11 = dump_sys_mmap;
            iVar12 = dump_sys_munmap;
            iVar13 = dump_sys_mremap;
            iVar14 = dump_sys_open;
            iVar15 = dump_msg;
            iVar16 = dump_sys_write;
            iVar17 = dump_object_tree_on_create_destroy;
            iVar18 = dump_memory_writes;
            iVar19 = dump_memory_reads;
            iVar20 = info;
            iVar21 = dump_raw_ioctl_data;
            iVar22 = dump_sys_mmap_details;
            iVar23 = print_gpu_addresses;
          }
        }
      }
LAB_00246394:
      print_gpu_addresses = iVar23;
      dump_sys_mmap_details = iVar22;
      dump_raw_ioctl_data = iVar21;
      info = iVar20;
      dump_memory_reads = iVar19;
      dump_memory_writes = iVar18;
      dump_object_tree_on_create_destroy = iVar17;
      dump_sys_write = iVar16;
      dump_msg = iVar15;
      dump_sys_open = iVar14;
      dump_sys_mremap = iVar13;
      dump_sys_munmap = iVar12;
      dump_sys_mmap = iVar11;
      decode_pb = iVar10;
      dump_buffer_usage = iVar9;
      dump_tcp = iVar8;
      dump_tep = iVar7;
      dump_cp = iVar6;
      dump_gp = iVar5;
      dump_fp = iVar4;
      dump_vp = iVar3;
      dump_tic = iVar2;
      dump_tsc = iVar1;
      dump_decoded_ioctl_data = iVar26;
    } while (local_40 != (char *)0x0);
  }
  free(local_38);
  return;
}

Assistant:

static void handle_filter_opt(const char *_arg, int en)
{
	char *arg = strdup(_arg);
	char *tokens = arg;

	while (tokens)
	{
		char *token = strsep(&tokens, ",");
		if (strcmp(token, "write") == 0)
			_filter_write(en);
		else if (strcmp(token, "read") == 0)
			_filter_read(en);
		else if (strcmp(token, "gpu-addr") == 0)
			_filter_gpu_addr(en);
		else if (strcmp(token, "mem") == 0)
		{
			_filter_write(en);
			_filter_read(en);
		}
		else if (strcmp(token, "ioctl-raw") == 0)
			_filter_ioctl_raw(en);
		else if (strcmp(token, "ioctl-desc") == 0)
			_filter_ioctl_desc(en);
		else if (strcmp(token, "ioctl") == 0)
		{
			if (!en)
				_filter_ioctl_raw(en);
			_filter_ioctl_desc(en);
			_filter_dump_object_tree_on_create_destroy(en);
		}
		else if (strcmp(token, "tsc") == 0)
			_filter_tsc(en);
		else if (strcmp(token, "tic") == 0)
			_filter_tic(en);
		else if (strcmp(token, "vp") == 0)
			_filter_vp(en);
		else if (strcmp(token, "fp") == 0)
			_filter_fp(en);
		else if (strcmp(token, "gp") == 0)
			_filter_gp(en);
		else if (strcmp(token, "cp") == 0)
			_filter_cp(en);
		else if (strcmp(token, "tep") == 0)
			_filter_tep(en);
		else if (strcmp(token, "tcp") == 0)
			_filter_tcp(en);
		else if (strcmp(token, "shader") == 0)
		{
			_filter_vp(en);
			_filter_fp(en);
			_filter_gp(en);
			_filter_tcp(en);
			_filter_tep(en);
		}
		else if (strcmp(token, "macro-rt-verbose") == 0)
			_filter_macro_rt_verbose(en);
		else if (strcmp(token, "macro-rt") == 0)
			_filter_macro_rt(en);
		else if (strcmp(token, "macro-dis") == 0)
			_filter_macro_dis_enabled(en);
		else if (strcmp(token, "macro") == 0)
		{
			if (!en)
				_filter_macro_rt_verbose(en);
			_filter_macro_rt(en);
			_filter_macro_dis_enabled(en);
		}
		else if (strcmp(token, "buffer-usage") == 0)
			_filter_buffer_usage(en);
		else if (strncmp(token, "class=", 6) == 0)
		{
			if (strcmp(token + 6, "all") == 0)
				_filter_all_classes(en);
			else
				_filter_class(token + 6, en);
		}
		else if (strcmp(token, "pb") == 0)
			_filter_decode_pb(en);
		else if (strcmp(token, "sys_mmap") == 0)
			_filter_sys_mmap(en);
		else if (strcmp(token, "sys_mmap_details") == 0)
			_filter_sys_mmap_details(en);
		else if (strcmp(token, "sys_munmap") == 0)
			_filter_sys_munmap(en);
		else if (strcmp(token, "sys_mremap") == 0)
			_filter_sys_mremap(en);
		else if (strcmp(token, "sys_open") == 0)
			_filter_sys_open(en);
		else if (strcmp(token, "msg") == 0)
			_filter_msg(en);
		else if (strcmp(token, "sys_write") == 0)
			_filter_sys_write(en);
		else if (strcmp(token, "sys") == 0)
		{
			_filter_sys_mmap(en);
			if (!en)
				_filter_sys_mmap_details(en);
			_filter_sys_munmap(en);
			_filter_sys_mremap(en);
			_filter_sys_open(en);
			_filter_sys_write(en);

			if (!en)
				_filter_ioctl_raw(en);
			_filter_ioctl_desc(en);
			_filter_dump_object_tree_on_create_destroy(en);
		}
		else if (strcmp(token, "nvrm-handle-desc") == 0)
			_filter_nvrm_describe_handles(en);
		else if (strcmp(token, "nvrm-class-desc") == 0)
			_filter_nvrm_describe_classes(en);
		else if (strncmp(token, "nvrm-mthd=", 10) == 0)
		{
			if (strcmp(token + 10, "all") == 0)
				_filter_all_nvrm_mthds(en);
			else
				_filter_nvrm_mthd(token + 10, en);
			if (en)
			{
				_filter_nvrm_ioctl("call", en);
				_filter_ioctl_desc(en);
			}
		}
		else if (strcmp(token, "nvrm-unk-0-fields") == 0)
			_filter_nvrm_show_unk_zero_fields(en);
		else if (strncmp(token, "nvrm-ioctl=", 11) == 0)
		{
			if (strcmp(token + 11, "all") == 0)
				_filter_all_nvrm_ioctls(en);
			else
				_filter_nvrm_ioctl(token + 11, en);
			if (en)
				_filter_ioctl_desc(en);
		}
		else if (strcmp(token, "nvrm-obj-tree") == 0)
			_filter_dump_object_tree_on_create_destroy(en);
		else if (strcmp(token, "nvrm") == 0)
		{
			if (en)
				_filter_ioctl_desc(en);
			_filter_all_nvrm_ioctls(en);
			_filter_all_nvrm_mthds(en);
			_filter_nvrm_describe_handles(en);
			_filter_nvrm_describe_classes(en);
			_filter_dump_object_tree_on_create_destroy(en);
		}
		else if (strcmp(token, "info") == 0)
			_filter_info(en);
		else if (strcmp(token, "all") == 0)
		{
			_filter_info(en);
			_filter_write(en);
			_filter_read(en);
			_filter_gpu_addr(en);
			_filter_ioctl_raw(en);
			_filter_ioctl_desc(en);
			_filter_tsc(en);
			_filter_tic(en);
			_filter_vp(en);
			_filter_fp(en);
			_filter_gp(en);
			_filter_cp(en);
			_filter_tep(en);
			_filter_tcp(en);
			_filter_macro_rt_verbose(en);
			_filter_macro_rt(en);
			_filter_macro_dis_enabled(en);
			_filter_buffer_usage(en);
			_filter_all_classes(en);
			_filter_decode_pb(en);
			_filter_sys_mmap(en);
			_filter_sys_mmap_details(en);
			_filter_sys_munmap(en);
			_filter_sys_mremap(en);
			_filter_sys_open(en);
			_filter_msg(en);
			_filter_sys_write(en);
			_filter_nvrm_describe_handles(en);
			_filter_nvrm_describe_classes(en);
			_filter_all_nvrm_mthds(en);
			_filter_nvrm_show_unk_zero_fields(en);
			_filter_all_nvrm_ioctls(en);
			_filter_dump_object_tree_on_create_destroy(en);
		}
		else
		{
			fprintf(stderr, "unknown token: %s\n", token);
			fflush(stderr);
			exit(1);
		}
	}

	free(arg);
}